

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tok.c
# Opt level: O0

void tok_del_define(tokcxdef *ctx,char *sym,int len)

{
  int iVar1;
  int iVar2;
  int in_EDX;
  char *in_RSI;
  long in_RDI;
  tokdfdef *prv;
  tokdfdef *df;
  int hsh;
  undefined8 *local_28;
  undefined8 *local_20;
  
  iVar1 = tokdfhsh(in_RSI,in_EDX);
  local_28 = (undefined8 *)0x0;
  local_20 = *(undefined8 **)(in_RDI + 0x2b0 + (long)iVar1 * 8);
  while( true ) {
    if (local_20 == (undefined8 *)0x0) {
      return;
    }
    if ((*(int *)(local_20 + 2) == in_EDX) &&
       (iVar2 = memcmp((void *)local_20[1],in_RSI,(long)in_EDX), iVar2 == 0)) break;
    local_28 = local_20;
    local_20 = (undefined8 *)*local_20;
  }
  if (local_28 == (undefined8 *)0x0) {
    *(undefined8 *)(in_RDI + 0x2b0 + (long)iVar1 * 8) = *local_20;
  }
  else {
    *local_28 = *local_20;
  }
  free(local_20);
  return;
}

Assistant:

void tok_del_define(tokcxdef *ctx, char *sym, int len)
{
    int       hsh;
    tokdfdef *df;
    tokdfdef *prv;
    
    /* find the appropriate chain the hash table */
    hsh = tokdfhsh(sym, len);

    /* search the chain for this symbol */
    for (prv = 0, df = ctx->tokcxdf[hsh] ; df ; prv = df, df = df->nxt)
    {
        /* if this one matches, delete it */
        if (df->len == len && !memcmp(df->nm, sym, (size_t)len))
        {
            /* unlink it from the chain */
            if (prv)
                prv->nxt = df->nxt;
            else
                ctx->tokcxdf[hsh] = df->nxt;

            /* delete this symbol, and we're done */
            mchfre(df);
            break;
        }
    }
}